

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::Finish(cmProcess *this)

{
  bool bVar1;
  pointer this_00;
  duration<double,_std::ratio<1L,_1L>_> dVar2;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  rep_conflict local_18;
  cmProcess *local_10;
  cmProcess *this_local;
  
  local_10 = this;
  local_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_20.__r = (rep)std::chrono::operator-(&local_28,&this->StartTime);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_18,&local_20);
  (this->TotalTime).__r = local_18;
  local_30 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator<=(&this->TotalTime,&local_30);
  if (bVar1) {
    dVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    (this->TotalTime).__r = dVar2.__r;
  }
  this_00 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                      (&this->Runner);
  cmCTestRunTest::FinalizeTest(this_00,true);
  return;
}

Assistant:

void cmProcess::Finish()
{
  this->TotalTime = std::chrono::steady_clock::now() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= cmDuration::zero()) {
    this->TotalTime = cmDuration::zero();
  }
  this->Runner->FinalizeTest();
}